

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberAccess.h
# Opt level: O0

void __thiscall
MemberAccess::MemberAccess(MemberAccess *this,ptr<Expression> *left,ptr<Expression> *right)

{
  shared_ptr<Expression> local_50;
  shared_ptr<Expression> local_40;
  shared_ptr<Operation> local_30;
  ptr<Expression> *local_20;
  ptr<Expression> *right_local;
  ptr<Expression> *left_local;
  MemberAccess *this_local;
  
  local_20 = right;
  right_local = left;
  left_local = (ptr<Expression> *)this;
  std::shared_ptr<Operation>::shared_ptr(&local_30,(nullptr_t)0x0);
  std::shared_ptr<Expression>::shared_ptr(&local_40,left);
  std::shared_ptr<Expression>::shared_ptr(&local_50,right);
  BinaryOperator::BinaryOperator(&this->super_BinaryOperator,&local_30,&local_40,&local_50);
  std::shared_ptr<Expression>::~shared_ptr(&local_50);
  std::shared_ptr<Expression>::~shared_ptr(&local_40);
  std::shared_ptr<Operation>::~shared_ptr(&local_30);
  (this->super_BinaryOperator).super_Expression._vptr_Expression =
       (_func_int **)&PTR_evaluate_001958b0;
  return;
}

Assistant:

MemberAccess(ptr<Expression> left, ptr<Expression> right) : BinaryOperator(nullptr, std::move(left), std::move(right)) { }